

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int argc_local;
  time_t t;
  aiLogStream logstream;
  
  argc_local = argc;
  testing::InitGoogleTest(&argc_local,argv);
  time(&t);
  srand((uint)t);
  Assimp::DefaultLogger::create("AssimpLog_Cpp.txt",VERBOSE,9,(IOSystem *)0x0);
  aiEnableVerboseLogging(1);
  logstream = aiGetPredefinedLogStream(aiDefaultLogStream_FILE,"AssimpLog_C.txt");
  aiAttachLogStream(&logstream);
  iVar1 = RUN_ALL_TESTS();
  aiDetachAllLogStreams();
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{
    ::testing::InitGoogleTest(&argc, argv);

    // seed the randomizer with the current system time
    time_t t;time(&t);
    srand((unsigned int)t);

    // ............................................................................

    // create a logger from both CPP
    Assimp::DefaultLogger::create("AssimpLog_Cpp.txt",Assimp::Logger::VERBOSE,
        aiDefaultLogStream_DEBUGGER | aiDefaultLogStream_FILE);

    // .. and C. They should smoothly work together
    aiEnableVerboseLogging(AI_TRUE);
    aiLogStream logstream= aiGetPredefinedLogStream(aiDefaultLogStream_FILE, "AssimpLog_C.txt");
    aiAttachLogStream(&logstream);

    int result = RUN_ALL_TESTS();

    // ............................................................................
    // but shutdown must be done from C to ensure proper deallocation
    aiDetachAllLogStreams();

    return result;
}